

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.hpp
# Opt level: O1

void ellipses::display_ellipses<cv::RotatedRect*>
               (Mat *image_test,RotatedRect *ellipses_begin,RotatedRect *ellipses_end)

{
  Mat tmp;
  long *local_c8;
  undefined8 uStack_c0;
  long local_b8 [2];
  _InputArray local_a8;
  Mat local_90 [96];
  
  cv::Mat::clone();
  if (ellipses_begin != ellipses_end) {
    do {
      local_a8.sz.width = 0;
      local_a8.sz.height = 0;
      local_a8.flags = 0x3010000;
      local_a8.obj = local_90;
      local_c8 = (long *)0x0;
      uStack_c0 = 0x406fe00000000000;
      local_b8[0] = 0;
      local_b8[1] = 0;
      cv::ellipse((_InputOutputArray *)&local_a8,ellipses_begin,(Scalar_ *)&local_c8,3,8);
      ellipses_begin = ellipses_begin + 1;
    } while (ellipses_begin != ellipses_end);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Output","");
  cv::namedWindow((string *)&local_c8,0);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Output","");
  local_a8.sz.width = 0;
  local_a8.sz.height = 0;
  local_a8.flags = 0x1010000;
  local_a8.obj = local_90;
  cv::imshow((string *)&local_c8,&local_a8);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void display_ellipses(const cv::Mat& image_test, IT ellipses_begin, IT ellipses_end)
{
    cv::Mat tmp = image_test.clone();
    while(ellipses_begin != ellipses_end)
    {
        cv::ellipse(tmp, *ellipses_begin, cv::Scalar(0, 255, 0), 3);
        ++ellipses_begin;
    }

    cv::namedWindow("Output", cv::WINDOW_NORMAL);
    cv::imshow("Output", tmp);
    cv::waitKey(0);
    cv::destroyAllWindows();
}